

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a7880 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a7887._0_1_ = '-';
    uRam00000000001a7887._1_1_ = '-';
    uRam00000000001a7887._2_1_ = '-';
    uRam00000000001a7887._3_1_ = '-';
    uRam00000000001a7887._4_1_ = '-';
    uRam00000000001a7887._5_1_ = '-';
    uRam00000000001a7887._6_1_ = '-';
    uRam00000000001a7887._7_1_ = '-';
    DAT_001a7870 = '-';
    DAT_001a7870_1._0_1_ = '-';
    DAT_001a7870_1._1_1_ = '-';
    DAT_001a7870_1._2_1_ = '-';
    DAT_001a7870_1._3_1_ = '-';
    DAT_001a7870_1._4_1_ = '-';
    DAT_001a7870_1._5_1_ = '-';
    DAT_001a7870_1._6_1_ = '-';
    uRam00000000001a7878 = 0x2d2d2d2d2d2d2d;
    DAT_001a787f = 0x2d;
    DAT_001a7860 = '-';
    DAT_001a7860_1._0_1_ = '-';
    DAT_001a7860_1._1_1_ = '-';
    DAT_001a7860_1._2_1_ = '-';
    DAT_001a7860_1._3_1_ = '-';
    DAT_001a7860_1._4_1_ = '-';
    DAT_001a7860_1._5_1_ = '-';
    DAT_001a7860_1._6_1_ = '-';
    uRam00000000001a7868._0_1_ = '-';
    uRam00000000001a7868._1_1_ = '-';
    uRam00000000001a7868._2_1_ = '-';
    uRam00000000001a7868._3_1_ = '-';
    uRam00000000001a7868._4_1_ = '-';
    uRam00000000001a7868._5_1_ = '-';
    uRam00000000001a7868._6_1_ = '-';
    uRam00000000001a7868._7_1_ = '-';
    DAT_001a7850 = '-';
    DAT_001a7850_1._0_1_ = '-';
    DAT_001a7850_1._1_1_ = '-';
    DAT_001a7850_1._2_1_ = '-';
    DAT_001a7850_1._3_1_ = '-';
    DAT_001a7850_1._4_1_ = '-';
    DAT_001a7850_1._5_1_ = '-';
    DAT_001a7850_1._6_1_ = '-';
    uRam00000000001a7858._0_1_ = '-';
    uRam00000000001a7858._1_1_ = '-';
    uRam00000000001a7858._2_1_ = '-';
    uRam00000000001a7858._3_1_ = '-';
    uRam00000000001a7858._4_1_ = '-';
    uRam00000000001a7858._5_1_ = '-';
    uRam00000000001a7858._6_1_ = '-';
    uRam00000000001a7858._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001a7848._0_1_ = '-';
    uRam00000000001a7848._1_1_ = '-';
    uRam00000000001a7848._2_1_ = '-';
    uRam00000000001a7848._3_1_ = '-';
    uRam00000000001a7848._4_1_ = '-';
    uRam00000000001a7848._5_1_ = '-';
    uRam00000000001a7848._6_1_ = '-';
    uRam00000000001a7848._7_1_ = '-';
    DAT_001a788f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}